

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

void xml_skip_whitespace(xml_parser *parser)

{
  ushort **ppuVar1;
  xml_parser *parser_local;
  
  while ((ppuVar1 = __ctype_b_loc(),
         ((*ppuVar1)[(int)(uint)parser->buffer[parser->position]] & 0x2000) != 0 &&
         (parser->position + 1 < parser->length))) {
    parser->position = parser->position + 1;
  }
  return;
}

Assistant:

static void xml_skip_whitespace(struct xml_parser* parser) {
	xml_parser_info(parser, "whitespace");

	while (isspace(parser->buffer[parser->position])) {
		if (parser->position + 1 >= parser->length) {
			return;
		} else {
			parser->position++;
		}
	}
}